

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblock.c
# Opt level: O0

_Bool no_nonblock(int fd)

{
  FILE *pFVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  int fdflags;
  int fd_local;
  
  uVar2 = fcntl(fd,3);
  pFVar1 = _stderr;
  if ((int)uVar2 < 0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(pFVar1,"%d: fcntl(F_GETFL): %s\n",(ulong)(uint)fd,pcVar5);
    exit(1);
  }
  iVar3 = fcntl(fd,4,(ulong)(uVar2 & 0xfffff7ff));
  pFVar1 = _stderr;
  if (iVar3 < 0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(pFVar1,"%d: fcntl(F_SETFL): %s\n",(ulong)(uint)fd,pcVar5);
    exit(1);
  }
  return (uVar2 & 0x800) != 0;
}

Assistant:

bool no_nonblock(int fd)
{
    int fdflags;

    fdflags = fcntl(fd, F_GETFL);
    if (fdflags < 0) {
        fprintf(stderr, "%d: fcntl(F_GETFL): %s\n", fd, strerror(errno));
        exit(1);
    }
    if (fcntl(fd, F_SETFL, fdflags & ~O_NONBLOCK) < 0) {
        fprintf(stderr, "%d: fcntl(F_SETFL): %s\n", fd, strerror(errno));
        exit(1);
    }

    return fdflags & O_NONBLOCK;
}